

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsSurfaceGeometry.h
# Opt level: O0

void __thiscall
anurbs::NurbsSurfaceGeometry<3L>::NurbsSurfaceGeometry
          (NurbsSurfaceGeometry<3L> *this,Index degree_u,Index degree_v,VectorXd *knots_u,
          VectorXd *knots_v,Poles *poles)

{
  VectorXd *degree;
  Index IVar1;
  Index IVar2;
  Index IVar3;
  runtime_error *this_00;
  int local_48 [4];
  Poles *local_38;
  Poles *poles_local;
  VectorXd *knots_v_local;
  VectorXd *knots_u_local;
  Index degree_v_local;
  Index degree_u_local;
  NurbsSurfaceGeometry<3L> *this_local;
  
  local_38 = poles;
  poles_local = (Poles *)knots_v;
  knots_v_local = knots_u;
  knots_u_local = (VectorXd *)degree_v;
  degree_v_local = degree_u;
  degree_u_local = (Index)this;
  SurfaceBase<3L>::SurfaceBase(&this->super_SurfaceBase<3L>);
  IVar2 = degree_v_local;
  (this->super_SurfaceBase<3L>)._vptr_SurfaceBase =
       (_func_int **)&PTR__NurbsSurfaceGeometry_00774260;
  this->m_degree_u = degree_v_local;
  this->m_degree_v = (Index)knots_u_local;
  IVar1 = length<Eigen::Matrix<double,_1,1,0,_1,1>>(knots_v_local);
  IVar2 = Nurbs::nb_poles(IVar2,IVar1);
  degree = knots_u_local;
  this->m_nb_poles_u = IVar2;
  IVar2 = length<Eigen::Matrix<double,_1,1,0,_1,1>>((Matrix<double,__1,_1,_0,__1,_1> *)poles_local);
  IVar2 = Nurbs::nb_poles((Index)degree,IVar2);
  this->m_nb_poles_v = IVar2;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->m_knots_u,knots_v_local);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            (&this->m_knots_v,(Matrix<double,__1,_1,_0,__1,_1> *)poles_local);
  Eigen::Matrix<double,_-1,_3,_1,_-1,_3>::Matrix(&this->m_poles,local_38);
  local_48[0] = 0;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&this->m_weights,local_48);
  IVar2 = nb_poles_u(this);
  IVar1 = nb_poles_v(this);
  IVar3 = nb_poles(this);
  if (IVar2 * IVar1 != IVar3) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Number of knots and poles do not match");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

NurbsSurfaceGeometry(
        const Index degree_u,
        const Index degree_v,
        const Eigen::VectorXd& knots_u,
        const Eigen::VectorXd& knots_v,
        const Poles& poles)
        : m_degree_u(degree_u)
        , m_degree_v(degree_v)
        , m_nb_poles_u(Nurbs::nb_poles(degree_u, length(knots_u)))
        , m_nb_poles_v(Nurbs::nb_poles(degree_v, length(knots_v)))
        , m_knots_u(knots_u)
        , m_knots_v(knots_v)
        , m_poles(poles)
        , m_weights(0)
    {
        static_assert(TDimension > 0);

        if (nb_poles_u() * nb_poles_v() != nb_poles()) {
            throw std::runtime_error("Number of knots and poles do not match");
        }
    }